

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O0

void __thiscall ObjLoader::cleanUpDuplicates(ObjLoader *this)

{
  pointer this_00;
  bool bVar1;
  vec3 *pvVar2;
  reference position_00;
  reference normal_00;
  reference tangent_00;
  reference color_00;
  pointer ppVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  reference puVar6;
  reference pvVar7;
  value_type_conflict1 local_1f0;
  uint local_1ec;
  iterator iStack_1e8;
  uint oldIndex;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cleanIBO_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ibo;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  size_t index_1;
  size_t index;
  byte local_179;
  _Node_iterator_base<std::pair<const_PackedVertexPNTCUV,_unsigned_long>,_true> _Stack_178;
  bool found;
  iterator uniqueIndexIterator;
  undefined1 local_15c [8];
  PackedVertexPNTCUV vertex;
  vec2 *uv;
  vec4 *color;
  vec3 *tangent;
  vec3 *normal;
  vec3 *position;
  size_t k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertexNewIndices;
  unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
  uniqueVertexIndices;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  cleanUVs;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  cleanColors;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  cleanTangents;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  cleanNormals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  cleanPositions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cleanIBO;
  ObjLoader *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &cleanPositions.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)&cleanNormals.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)&cleanTangents.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)&cleanColors.
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
            *)&cleanUVs.
               super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)&uniqueVertexIndices._M_h._M_single_bucket);
  std::
  unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
  ::unordered_map((unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
                   *)&vertexNewIndices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&k);
  position = (vec3 *)0x0;
  while( true ) {
    pvVar2 = (vec3 *)std::
                     vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ::size(&this->m_vertexPositions);
    if (pvVar2 <= position) break;
    position_00 = std::
                  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ::operator[](&this->m_vertexPositions,(size_type)position);
    normal_00 = std::
                vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ::operator[](&this->m_vertexNormals,(size_type)position);
    tangent_00 = std::
                 vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ::operator[](&this->m_vertexTangents,(size_type)position);
    color_00 = std::
               vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ::operator[](&this->m_vertexColors,(size_type)position);
    vertex.uv.field_0 =
         (anon_union_8_3_e2189aaa_for_vec<2,_float,_(glm::qualifier)0>_3)
         std::
         vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
         ::operator[](&this->m_vertexUVs,(size_type)position);
    PackedVertexPNTCUV::PackedVertexPNTCUV
              ((PackedVertexPNTCUV *)local_15c,position_00,normal_00,tangent_00,color_00,
               (vec2 *)vertex.uv.field_0);
    _Stack_178._M_cur =
         (__node_type *)
         std::
         unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
         ::find((unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
                 *)&vertexNewIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(key_type *)local_15c);
    index = (size_t)std::
                    unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
                    ::end((unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
                           *)&vertexNewIndices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::__detail::operator==
                      (&stack0xfffffffffffffe88,
                       (_Node_iterator_base<std::pair<const_PackedVertexPNTCUV,_unsigned_long>,_true>
                        *)&index);
    local_179 = (bVar1 ^ 0xffU) & 1;
    if (local_179 == 0) {
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&cleanNormals.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,position_00);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&cleanTangents.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,normal_00);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&cleanColors.
                      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,tangent_00);
      std::
      vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                   *)&cleanUVs.
                      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,color_00);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   *)&uniqueVertexIndices._M_h._M_single_bucket,(value_type *)vertex.uv.field_0);
      sVar4 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      *)&cleanNormals.
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __range1 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(sVar4 - 1);
      pmVar5 = std::
               unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
               ::operator[]((unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
                             *)&vertexNewIndices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (key_type *)local_15c);
      *pmVar5 = (mapped_type)(sVar4 - 1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&k,
                 (value_type_conflict5 *)&__range1);
    }
    else {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>,_false,_true>
                           *)&stack0xfffffffffffffe88);
      index_1 = ppVar3->second;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&k,&index_1);
    }
    position = (vec3 *)((long)&position->field_0 + 1);
  }
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin(&this->m_ibos);
  ibo = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::end(&this->m_ibos);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      (&__end1,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&ibo);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    cleanIBO_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator*(&__end1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    this_00 = cleanIBO_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        cleanIBO_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    iStack_1e8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        (&__end2,&stack0xfffffffffffffe18);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      local_1ec = *puVar6;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&k,
                          (ulong)local_1ec);
      local_1f0 = (value_type_conflict1)*pvVar7;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,&local_1f0);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               cleanIBO_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::operator=(&this->m_vertexPositions,
              (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)&cleanNormals.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::operator=(&this->m_vertexNormals,
              (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)&cleanTangents.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::operator=(&this->m_vertexTangents,
              (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)&cleanColors.
                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::operator=(&this->m_vertexColors,
              (vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               *)&cleanUVs.
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::operator=(&this->m_vertexUVs,
              (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)&uniqueVertexIndices._M_h._M_single_bucket);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&k);
  std::
  unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<PackedVertexPNTCUV,_unsigned_long,_std::hash<PackedVertexPNTCUV>,_std::equal_to<PackedVertexPNTCUV>,_std::allocator<std::pair<const_PackedVertexPNTCUV,_unsigned_long>_>_>
                    *)&vertexNewIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             *)&uniqueVertexIndices._M_h._M_single_bucket);
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
             *)&cleanUVs.
                super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)&cleanColors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)&cleanTangents.
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)&cleanNormals.
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &cleanPositions.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ObjLoader::cleanUpDuplicates()
{
  std::vector<unsigned int> cleanIBO;
  std::vector<glm::vec3> cleanPositions;
  std::vector<glm::vec3> cleanNormals;
  std::vector<glm::vec3> cleanTangents;
  std::vector<glm::vec4> cleanColors;
  std::vector<glm::vec2> cleanUVs;
  std::unordered_map<PackedVertexPNTCUV, size_t> uniqueVertexIndices;
  std::vector<size_t> vertexNewIndices;
  for (size_t k = 0; k < m_vertexPositions.size(); k++) {
    const glm::vec3 & position = m_vertexPositions[k];
    const glm::vec3 & normal = m_vertexNormals[k];
    const glm::vec3 & tangent = m_vertexTangents[k];
    const glm::vec4 & color = m_vertexColors[k];
    const glm::vec2 & uv = m_vertexUVs[k];
    PackedVertexPNTCUV vertex(position, normal, tangent, color, uv);
    auto uniqueIndexIterator = uniqueVertexIndices.find(vertex);
    bool found = (uniqueIndexIterator != uniqueVertexIndices.end());
    if (found) {
      size_t index = uniqueIndexIterator->second;
      vertexNewIndices.push_back(index);
    } else {
      cleanPositions.push_back(position);
      cleanNormals.push_back(normal);
      cleanTangents.push_back(tangent);
      cleanColors.push_back(color);
      cleanUVs.push_back(uv);
      size_t index = cleanPositions.size() - 1;
      uniqueVertexIndices[vertex] = index;
      vertexNewIndices.push_back(index);
    }
  }
  for (auto & ibo : m_ibos) {
    std::vector<unsigned int> cleanIBO;
    for (unsigned int oldIndex : ibo) {
      cleanIBO.push_back(vertexNewIndices[oldIndex]);
    }
    ibo = cleanIBO;
  }
  m_vertexPositions = cleanPositions;
  m_vertexNormals = cleanNormals;
  m_vertexTangents = cleanTangents;
  m_vertexColors = cleanColors;
  m_vertexUVs = cleanUVs;
}